

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-cardinalities.cc
# Opt level: O0

string * __thiscall
testing::(anonymous_namespace)::FormatTimes_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int n)

{
  ostream *poVar1;
  stringstream local_1b0 [8];
  stringstream ss;
  undefined1 local_1a0 [379];
  allocator local_25 [16];
  allocator local_15;
  int local_14;
  string *psStack_10;
  int n_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"once",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (local_14 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"twice",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar1 = (ostream *)std::ostream::operator<<(local_1a0,local_14);
    std::operator<<(poVar1," times");
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline internal::string FormatTimes(int n) {
  if (n == 1) {
    return "once";
  } else if (n == 2) {
    return "twice";
  } else {
    std::stringstream ss;
    ss << n << " times";
    return ss.str();
  }
}